

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Binary * __thiscall MixedArena::alloc<wasm::Binary>(MixedArena *this)

{
  Binary *pBVar1;
  
  pBVar1 = (Binary *)allocSpace(this,0x28,8);
  (pBVar1->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar1->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  return pBVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }